

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt)

{
  byte *pbVar1;
  ulong uVar2;
  byte *pbVar3;
  long lVar4;
  int ch1;
  int value;
  
  xmlXPathCompRelationalExpr(ctxt);
  if (ctxt->error != 0) {
    return;
  }
  pbVar1 = ctxt->cur;
  while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
    pbVar1 = pbVar1 + 1;
    ctxt->cur = pbVar1;
  }
  do {
    if ((char)uVar2 == '!') {
      if (pbVar1[1] != 0x3d) {
        return;
      }
      pbVar3 = pbVar1 + 1;
      ch1 = ctxt->comp->last;
      ctxt->cur = pbVar3;
      lVar4 = 2;
      value = 0;
      if (*pbVar3 != 0) goto LAB_001c24e6;
    }
    else {
      if ((int)uVar2 != 0x3d) {
        return;
      }
      ch1 = ctxt->comp->last;
      value = 1;
      lVar4 = 1;
LAB_001c24e6:
      ctxt->cur = pbVar1 + lVar4;
      pbVar3 = pbVar1 + lVar4;
    }
    while( true ) {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    }
    xmlXPathCompRelationalExpr(ctxt);
    if (ctxt->error != 0) {
      return;
    }
    xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_EQUAL,value,0,0,(void *)0x0,(void *)0x0);
    pbVar1 = ctxt->cur;
    while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
      pbVar1 = pbVar1 + 1;
      ctxt->cur = pbVar1;
    }
  } while( true );
}

Assistant:

static void
xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompRelationalExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '=') || ((CUR == '!') && (NXT(1) == '='))) {
	int eq;
	int op1 = ctxt->comp->last;

        if (CUR == '=') eq = 1;
	else eq = 0;
	NEXT;
	if (!eq) NEXT;
	SKIP_BLANKS;
        xmlXPathCompRelationalExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_EQUAL, op1, ctxt->comp->last, eq, 0);
	SKIP_BLANKS;
    }
}